

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O0

Byte * __thiscall
CharStringType2Interpreter::InterpretPut
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  anon_union_8_2_3d487603_for_CharStringOperand_1 aVar1;
  value_type vVar2;
  bool bVar3;
  undefined7 uVar4;
  int iVar5;
  size_type sVar6;
  Trace *this_00;
  reference pvVar7;
  reference pvVar8;
  double local_70;
  CharStringOperand valueB;
  CharStringOperand valueA;
  EStatusCode status;
  LongFilePositionType inReadLimit_local;
  Byte *inProgramCounter_local;
  CharStringType2Interpreter *this_local;
  
  iVar5 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x25])();
  if (iVar5 == 0) {
    sVar6 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::size
                      (&this->mOperandStack);
    if (sVar6 < 2) {
      this_00 = Trace::DefaultTrace();
      sVar6 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::size
                        (&this->mOperandStack);
      Trace::TraceToLog(this_00,
                        "CharStringType2Interpreter::InterpretPut, put should have at least 2 arguments on stack. got %d. aborting"
                        ,sVar6);
      this_local = (CharStringType2Interpreter *)0x0;
    }
    else {
      pvVar7 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::back
                         (&this->mOperandStack);
      vVar2 = *pvVar7;
      local_70 = (pvVar7->field_1).RealValue;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      pvVar7 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::back
                         (&this->mOperandStack);
      bVar3 = pvVar7->IsInteger;
      uVar4 = *(undefined7 *)&pvVar7->field_0x1;
      aVar1 = pvVar7->field_1;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      if (((undefined1  [16])vVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        local_70 = (double)(long)local_70;
      }
      pvVar8 = std::vector<CharStringOperand,_std::allocator<CharStringOperand>_>::operator[]
                         (&this->mStorage,(size_type)local_70);
      pvVar8->IsInteger = bVar3;
      *(undefined7 *)&pvVar8->field_0x1 = uVar4;
      pvVar8->field_1 = aVar1;
      this_local = (CharStringType2Interpreter *)inProgramCounter;
    }
  }
  else {
    this_local = (CharStringType2Interpreter *)0x0;
  }
  return (Byte *)this_local;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretPut(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Put(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;

	if(mOperandStack.size() < 2) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretPut, put should have at least 2 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}

	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();

	mStorage[(valueB.IsInteger ? valueB.IntegerValue : (long)valueB.RealValue)] = valueA;

	return inProgramCounter;
}